

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddIntersect(Abc_ZddMan *p,int a,int b)

{
  Abc_ZddObj *pAVar1;
  Abc_ZddObj *pAVar2;
  Abc_ZddObj *pAVar3;
  uint Var;
  int iVar4;
  uint True;
  int Arg0;
  
  do {
    Arg0 = a;
    a = b;
    if (Arg0 == 0) {
      return 0;
    }
    if (a == 0) {
      return 0;
    }
    if (Arg0 == a) {
      return Arg0;
    }
    b = Arg0;
  } while (a < Arg0);
  iVar4 = Abc_ZddCacheLookup(p,Arg0,a,4);
  if (iVar4 < 0) {
    pAVar3 = p->pObjs;
    pAVar1 = pAVar3 + Arg0;
    pAVar2 = pAVar3 + a;
    if ((*(uint *)(pAVar3 + Arg0) & 0x7fffffff) < (*(uint *)(pAVar3 + a) & 0x7fffffff)) {
      iVar4 = Abc_ZddIntersect(p,pAVar1->False,a);
      True = pAVar1->True;
    }
    else if ((*(uint *)(pAVar3 + a) & 0x7fffffff) < (*(uint *)(pAVar3 + Arg0) & 0x7fffffff)) {
      iVar4 = Abc_ZddIntersect(p,Arg0,pAVar2->False);
      True = pAVar2->True;
    }
    else {
      iVar4 = Abc_ZddIntersect(p,pAVar1->False,pAVar2->False);
      True = Abc_ZddIntersect(p,pAVar1->True,pAVar2->True);
    }
    Var = *(uint *)pAVar2 & 0x7fffffff;
    if ((*(uint *)pAVar1 & 0x7fffffff) < (*(uint *)pAVar2 & 0x7fffffff)) {
      Var = *(uint *)pAVar1 & 0x7fffffff;
    }
    iVar4 = Abc_ZddUniqueCreate(p,Var,True,iVar4);
    Abc_ZddCacheInsert(p,Arg0,a,4,iVar4);
  }
  return iVar4;
}

Assistant:

int Abc_ZddIntersect( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A, * B; 
    int r0, r1, r;
    if ( a == 0 ) return 0;
    if ( b == 0 ) return 0;
    if ( a == b ) return a;
    if ( a > b )  return Abc_ZddIntersect( p, b, a );
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_INTER)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    B = Abc_ZddNode( p, b );
    if ( A->Var < B->Var )
        r0 = Abc_ZddIntersect( p, A->False, b ), 
        r1 = A->True;
    else if ( A->Var > B->Var )
        r0 = Abc_ZddIntersect( p, a, B->False ), 
        r1 = B->True;
    else
        r0 = Abc_ZddIntersect( p, A->False, B->False ), 
        r1 = Abc_ZddIntersect( p, A->True, B->True );
    r = Abc_ZddUniqueCreate( p, Abc_MinInt(A->Var, B->Var), r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_INTER, r );
}